

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBox::focusOutEvent(QAbstractSpinBox *this,QFocusEvent *event)

{
  QAbstractSpinBoxPrivate *this_00;
  
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  if ((this_00->field_0x3d0 & 1) != 0) {
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xd0))(this_00,0);
  }
  QAbstractSpinBoxPrivate::reset(this_00);
  (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x28))(this_00->edit,event);
  (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xc0))(this_00);
  QWidget::focusOutEvent((QWidget *)this,event);
  editingFinished(this);
  return;
}

Assistant:

void QAbstractSpinBox::focusOutEvent(QFocusEvent *event)
{
    Q_D(QAbstractSpinBox);

    if (d->pendingEmit)
        d->interpret(EmitIfChanged);

    d->reset();
    d->edit->event(event);
    d->updateEdit();
    QWidget::focusOutEvent(event);

#ifdef QT_KEYPAD_NAVIGATION
    // editingFinished() is already emitted on LeaveEditFocus
    if (!QApplicationPrivate::keypadNavigationEnabled())
#endif
    emit editingFinished();
}